

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
__thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
static_resources::
create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::list_projection>
          (static_resources *this,list_projection *val)

{
  pointer ppeVar1;
  bool bVar2;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *peVar3;
  pointer __p;
  pointer *__ptr;
  __single_object temp;
  list_projection *local_28;
  _Head_base<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  local_20;
  
  peVar3 = (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *)operator_new(0x30);
  (peVar3->
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>).
  _vptr_expr_base = (_func_int **)&PTR__expr_base_00b5f6d0;
  peVar3->precedence_level_ = (val->super_projection_base).super_expression_type.precedence_level_;
  bVar2 = (val->super_projection_base).super_expression_type.is_projection_;
  peVar3->is_right_associative_ =
       (val->super_projection_base).super_expression_type.is_right_associative_;
  peVar3->is_projection_ = bVar2;
  (peVar3->
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>).
  _vptr_expr_base = (_func_int **)&PTR__projection_base_00b5f6a0;
  ppeVar1 = (val->super_projection_base).expressions_.
            super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  peVar3[1].
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>.
  _vptr_expr_base =
       (_func_int **)
       (val->super_projection_base).expressions_.
       super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  peVar3[1].precedence_level_ = (size_t)ppeVar1;
  *(pointer *)&peVar3[1].is_right_associative_ =
       (val->super_projection_base).expressions_.
       super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (val->super_projection_base).expressions_.
  super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (val->super_projection_base).expressions_.
  super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (val->super_projection_base).expressions_.
  super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (peVar3->
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>).
  _vptr_expr_base = (_func_int **)&PTR__projection_base_00b60118;
  local_28 = (list_projection *)0x0;
  local_20._M_head_impl =
       (expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
       peVar3;
  std::
  vector<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((vector<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
              *)(this + 0x38),
             (unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)&local_20);
  if ((expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
      )local_20._M_head_impl !=
      (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
      )0x0) {
    (*((expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
      &(local_20._M_head_impl)->_vptr_expr_base)->_vptr_expr_base[1])();
  }
  if (local_28 != (list_projection *)0x0) {
    std::
    default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::list_projection>
    ::operator()((default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::list_projection>
                  *)&local_28,local_28);
  }
  return peVar3;
}

Assistant:

expr_base_impl<Json>* create_expression(T&& val)
            {
                auto temp = jsoncons::make_unique<T>(std::forward<T>(val));
                expr_base_impl<Json>* ptr = temp.get();
                expr_storage_.push_back(std::move(temp));
                return ptr;
            }